

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.c
# Opt level: O3

int evfilt_timer_knote_create(filter *filt,knote *kn)

{
  unsigned_short *puVar1;
  uint uVar2;
  long lVar3;
  int __ufd;
  uint uVar4;
  int iVar5;
  itimerspec ts;
  undefined1 local_4c [12];
  itimerspec local_40;
  
  puVar1 = &(kn->kev).flags;
  *(byte *)puVar1 = (byte)*puVar1 | 0x20;
  __ufd = timerfd_create(1,0x80000);
  if (-1 < __ufd) {
    lVar3 = (kn->kev).data;
    uVar2 = (kn->kev).fflags;
    uVar4 = uVar2 & 7;
    if (uVar4 == 1) {
      local_40.it_value.tv_nsec = 0;
      local_40.it_value.tv_sec = lVar3;
    }
    else if (uVar4 == 4) {
      local_40.it_value.tv_sec = lVar3 / 1000000000;
      local_40.it_value.tv_nsec = lVar3 % 1000000000;
    }
    else if (uVar4 == 2) {
      local_40.it_value.tv_sec = lVar3 / 1000000;
      local_40.it_value.tv_nsec = (lVar3 % 1000000) * 1000;
    }
    else {
      local_40.it_value.tv_sec = lVar3 / 1000;
      local_40.it_value.tv_nsec = (lVar3 % 1000) * 1000000;
    }
    local_40.it_interval.tv_nsec = 0;
    local_40.it_interval.tv_sec = 0;
    if (((kn->kev).flags & 0x10) == 0) {
      local_40.it_interval.tv_nsec = local_40.it_value.tv_nsec;
      local_40.it_interval.tv_sec = local_40.it_value.tv_sec;
    }
    iVar5 = timerfd_settime(__ufd,uVar2 >> 3 & 1,&local_40,(itimerspec *)0x0);
    if (-1 < iVar5) {
      local_4c._0_4_ = (uint)(((kn->kev).flags & 0x90) != 0) << 0x1e | 0x80000001;
      local_4c._4_8_ = &kn->kn_udata;
      (kn->kn_udata).field_0.ud_kn = kn;
      (kn->kn_udata).ud_type = EPOLL_UDATA_KNOTE;
      iVar5 = epoll_ctl(filt->kf_kqueue->epollfd,1,__ufd,(epoll_event *)local_4c);
      if (-1 < iVar5) {
        (kn->field_10).kn_timerfd = __ufd;
        return 0;
      }
    }
    close(__ufd);
  }
  return -1;
}

Assistant:

int
evfilt_timer_knote_create(struct filter *filt, struct knote *kn)
{
    struct itimerspec ts;
    int tfd;
    int flags;
    int events;

    kn->kev.flags |= EV_CLEAR;

    tfd = timerfd_create(CLOCK_MONOTONIC, TFD_CLOEXEC);
    if (tfd < 0) {
        if ((errno == EMFILE) || (errno == ENFILE)) {
            dbg_perror("timerfd_create(2) fd_used=%u fd_max=%u", get_fd_used(), get_fd_limit());
        } else {
            dbg_perror("timerfd_create(2)");
        }
        return (-1);
    }
    dbg_printf("timer_fd=%i - created", tfd);

    convert_timedata_to_itimerspec(&ts, kn->kev.data, kn->kev.fflags,
                                   kn->kev.flags & EV_ONESHOT);
    flags = (kn->kev.fflags & NOTE_ABSOLUTE) ? TFD_TIMER_ABSTIME : 0;
    if (timerfd_settime(tfd, flags, &ts, NULL) < 0) {
        dbg_printf("timerfd_settime(2): %s", strerror(errno));
        close(tfd);
        return (-1);
    }

    events = EPOLLIN | EPOLLET;
    if (kn->kev.flags & (EV_ONESHOT | EV_DISPATCH))
        events |= EPOLLONESHOT;

    KN_UDATA(kn);   /* populate this knote's kn_udata field */
    if (epoll_ctl(filter_epoll_fd(filt), EPOLL_CTL_ADD, tfd, EPOLL_EV_KN(events, kn)) < 0) {
        dbg_printf("epoll_ctl(2): %d", errno);
        close(tfd);
        return (-1);
    }

    kn->kn_timerfd = tfd;
    return (0);
}